

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::ConditionalExpression::serializeTo
          (ConditionalExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  Condition *cond;
  pointer pCVar2;
  pointer pCVar3;
  string_view name;
  
  name._M_str = "conditions";
  name._M_len = 10;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->conditions)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pCVar2 = (this->conditions)._M_ptr;
    pCVar3 = pCVar2 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,4,"expr",(size_t)(pCVar2->expr).ptr);
      if (pCVar2->pattern != (Pattern *)0x0) {
        ASTSerializer::write(serializer,7,"pattern",(size_t)pCVar2->pattern);
      }
      ASTSerializer::endObject(serializer);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar3);
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  return;
}

Assistant:

void ConditionalExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("left", left());
    serializer.write("right", right());
}